

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall Instruction::~Instruction(Instruction *this)

{
  Instruction *this_local;
  
  ~Instruction(this);
  operator_delete(this);
  return;
}

Assistant:

Instruction::~Instruction() {
}